

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputOutput.h
# Opt level: O1

void idx2::ReadLines<256>(FILE *Fp,array<idx2::stack_array<char,_256>_> *Lines)

{
  long lVar1;
  char *pcVar2;
  size_t sVar3;
  stref Dst;
  stref Src;
  char Temp [256];
  anon_union_8_2_2df48d06_for_stref_0 local_158;
  undefined4 local_150;
  anon_union_8_2_2df48d06_for_stref_0 local_148;
  int local_140;
  char local_138 [264];
  
  do {
    pcVar2 = fgets(local_138,0x100,(FILE *)Fp);
    if (pcVar2 == (char *)0x0) {
      return;
    }
    local_148.Ptr = local_138;
    sVar3 = strlen(local_138);
    local_140 = (int)sVar3;
    if (local_138[local_140 + -1] == '\n') {
      local_138[local_140 + -2] = '\0';
    }
    if (Lines->Capacity <= Lines->Size) {
      GrowCapacity<idx2::stack_array<char,256>>(Lines,0);
    }
    lVar1 = Lines->Size;
    Lines->Size = lVar1 + 1;
    local_158.Ptr = (str)((Lines->Buffer).Data + lVar1 * 0x101);
    local_150 = 0x100;
    Copy((stref *)&local_148,(stref *)&local_158,true);
  } while (pcVar2 != (char *)0x0);
  return;
}

Assistant:

void
ReadLines(FILE* Fp, array<stack_array<char, N>>* Lines)
{
  while (true)
  {
    char Temp[N];
    if (!fgets(Temp, N, Fp))
      return;

    stref Src(Temp);
    if (Temp[Src.Size - 1] == '\n')
      Temp[Src.Size - 2] = 0; // override the new line character
    PushBack(Lines);
    stref Dst(Back(*Lines).Arr, N);
    Copy(Src, &Dst, true);
  }
}